

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_drawStats(void)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  char *pcVar3;
  int iVar4;
  int x;
  int iVar5;
  
  iVar4 = (IntermissionFont->FontHeight * 3) / 2;
  WI_drawBackground();
  WI_drawLF();
  pDVar2 = screen;
  pFVar1 = BigFont;
  if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    pcVar3 = FStringTable::operator()(&GStrings,"TXT_IMKILLS");
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0xb,0x32,0x41,pcVar3,0x40001390,1,0x40001398,1,0);
    pDVar2 = screen;
    pFVar1 = BigFont;
    pcVar3 = FStringTable::operator()(&GStrings,"TXT_IMITEMS");
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0xb,0x32,0x5a,pcVar3,0x40001390,1,0x40001398,1,0);
    pDVar2 = screen;
    pFVar1 = BigFont;
    pcVar3 = FStringTable::operator()(&GStrings,"TXT_IMSECRETS");
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0xb,0x32,0x73,pcVar3,0x40001390,1,0x40001398,1,0);
    iVar4 = 0x10e;
    if (gameinfo.gametype == GAME_Strife) {
      iVar4 = 0x11d;
    }
    if (1 < sp_state) {
      WI_drawPercent(IntermissionFont,iVar4,0x41,cnt_kills[0],wbs->maxkills,true,CR_UNTRANSLATED);
      if (3 < sp_state) {
        WI_drawPercent(IntermissionFont,iVar4,0x5a,cnt_items[0],wbs->maxitems,true,CR_UNTRANSLATED);
        if (5 < sp_state) {
          WI_drawPercent(IntermissionFont,iVar4,0x73,cnt_secret[0],wbs->maxsecret,true,
                         CR_UNTRANSLATED);
          pDVar2 = screen;
          pFVar1 = BigFont;
          if (7 < sp_state) {
            pcVar3 = FStringTable::operator()(&GStrings,"TXT_IMTIME");
            DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0xb,0x55,0xa0,pcVar3,0x40001390,1,0x40001398,
                              1,0);
            WI_drawTime(0xf9,0xa0,cnt_time,false);
            if (wi_showtotaltime.Value == true) {
              x = 0xf9;
              iVar5 = 0xb4;
              iVar4 = cnt_total_time;
              goto LAB_0049540d;
            }
          }
        }
      }
    }
  }
  else {
    DCanvas::DrawTexture((DCanvas *)screen,kills,50.0,50.0,0x40001390,1,0);
    WI_drawPercent(IntermissionFont,0x10e,0x32,cnt_kills[0],wbs->maxkills,true,CR_UNTRANSLATED);
    DCanvas::DrawTexture((DCanvas *)screen,items,50.0,(double)(iVar4 + 0x32),0x40001390,1,0);
    WI_drawPercent(IntermissionFont,0x10e,iVar4 + 0x32,cnt_items[0],wbs->maxitems,true,
                   CR_UNTRANSLATED);
    iVar5 = iVar4 * 2 + 0x32;
    DCanvas::DrawTexture((DCanvas *)screen,sp_secret,50.0,(double)iVar5,0x40001390,1,0);
    WI_drawPercent(IntermissionFont,0x10e,iVar5,cnt_secret[0],wbs->maxsecret,true,CR_UNTRANSLATED);
    DCanvas::DrawTexture((DCanvas *)screen,timepic,8.0,168.0,0x40001390,1,0);
    WI_drawTime(0x98,0xa8,cnt_time,false);
    if (wi_showtotaltime.Value == true) {
      WI_drawTime(0x98,iVar4 + 0xa8,cnt_total_time,true);
    }
    if (wbs->partime != 0) {
      DCanvas::DrawTexture((DCanvas *)screen,par,168.0,168.0,0x40001390,1,0);
      x = 0x138;
      iVar5 = 0xa8;
      iVar4 = cnt_par;
LAB_0049540d:
      WI_drawTime(x,iVar5,iVar4,false);
      return;
    }
  }
  return;
}

Assistant:

void WI_drawStats (void)
{
	// line height
	int lh; 	

	lh = IntermissionFont->GetHeight() * 3 / 2;

	// draw animated background
	WI_drawBackground(); 
	
	WI_drawLF();
	
	if (gameinfo.gametype & GAME_DoomChex)
	{
		screen->DrawTexture (kills, SP_STATSX, SP_STATSY, DTA_Clean, true, TAG_DONE);
		WI_drawPercent (IntermissionFont, 320 - SP_STATSX, SP_STATSY, cnt_kills[0], wbs->maxkills);

		screen->DrawTexture (items, SP_STATSX, SP_STATSY+lh, DTA_Clean, true, TAG_DONE);
		WI_drawPercent (IntermissionFont, 320 - SP_STATSX, SP_STATSY+lh, cnt_items[0], wbs->maxitems);

		screen->DrawTexture (sp_secret, SP_STATSX, SP_STATSY+2*lh, DTA_Clean, true, TAG_DONE);
		WI_drawPercent (IntermissionFont, 320 - SP_STATSX, SP_STATSY+2*lh, cnt_secret[0], wbs->maxsecret);

		screen->DrawTexture (timepic, SP_TIMEX, SP_TIMEY, DTA_Clean, true, TAG_DONE);
		WI_drawTime (160 - SP_TIMEX, SP_TIMEY, cnt_time);
		if (wi_showtotaltime)
		{
			WI_drawTime (160 - SP_TIMEX, SP_TIMEY + lh, cnt_total_time, true);	// no 'sucks' for total time ever!
		}

		if (wbs->partime)
		{
			screen->DrawTexture (par, 160 + SP_TIMEX, SP_TIMEY, DTA_Clean, true, TAG_DONE);
			WI_drawTime (320 - SP_TIMEX, SP_TIMEY, cnt_par);
		}

	}
	else
	{
		screen->DrawText (BigFont, CR_UNTRANSLATED, 50, 65, GStrings("TXT_IMKILLS"), DTA_Clean, true, DTA_Shadow, true, TAG_DONE);
		screen->DrawText (BigFont, CR_UNTRANSLATED, 50, 90, GStrings("TXT_IMITEMS"), DTA_Clean, true, DTA_Shadow, true, TAG_DONE);
		screen->DrawText (BigFont, CR_UNTRANSLATED, 50, 115, GStrings("TXT_IMSECRETS"), DTA_Clean, true, DTA_Shadow, true, TAG_DONE);

		int countpos = gameinfo.gametype==GAME_Strife? 285:270;
		if (sp_state >= 2)
		{
			WI_drawPercent (IntermissionFont, countpos, 65, cnt_kills[0], wbs->maxkills);
		}
		if (sp_state >= 4)
		{
			WI_drawPercent (IntermissionFont, countpos, 90, cnt_items[0], wbs->maxitems);
		}
		if (sp_state >= 6)
		{
			WI_drawPercent (IntermissionFont, countpos, 115, cnt_secret[0], wbs->maxsecret);
		}
		if (sp_state >= 8)
		{
			screen->DrawText (BigFont, CR_UNTRANSLATED, 85, 160, GStrings("TXT_IMTIME"),
				DTA_Clean, true, DTA_Shadow, true, TAG_DONE);
			WI_drawTime (249, 160, cnt_time);
			if (wi_showtotaltime)
			{
				WI_drawTime (249, 180, cnt_total_time);
			}
		}
	}
}